

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_traits_macro_functional_tests.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4574528::ns::Employee_AMN::Employee_AMN
          (Employee_AMN *this,string *name,string *surname)

{
  std::__cxx11::string::string((string *)this,(string *)name);
  std::__cxx11::string::string((string *)&this->surname_,(string *)surname);
  return;
}

Assistant:

Employee_AMN(const std::string& name, const std::string& surname)
            : name_(name), surname_(surname)
        {
        }